

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool __thiscall LTFlightData::validForAcCreate(LTFlightData *this,double simTime)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  double in_XMM0_Qa;
  double dVar6;
  positionTy *p1;
  lock_guard<std::recursive_mutex> lock;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  deque<positionTy,_std::allocator<positionTy>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int iVar7;
  undefined4 in_stack_fffffffffffffefc;
  positionTy *in_stack_ffffffffffffff00;
  double local_18;
  bool local_1;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  bVar1 = empty((LTFlightData *)0x1d1fb3);
  if (((bVar1) ||
      (bVar1 = std::deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
               ::empty((deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
                        *)0x1d1fd4), bVar1)) ||
     (sVar4 = std::deque<positionTy,_std::allocator<positionTy>_>::size
                        ((deque<positionTy,_std::allocator<positionTy>_> *)0x1d1fe6), sVar4 < 2)) {
    local_1 = false;
  }
  else {
    uVar2 = std::isnan(in_XMM0_Qa);
    local_18 = in_XMM0_Qa;
    if ((uVar2 & 1) != 0) {
      local_18 = DataRefs::GetSimTime(&dataRefs);
    }
    pvVar5 = std::deque<positionTy,_std::allocator<positionTy>_>::front
                       ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_ffffffffffffff00)
    ;
    dVar6 = positionTy::ts(pvVar5);
    if (dVar6 <= local_18) {
      pvVar5 = std::deque<positionTy,_std::allocator<positionTy>_>::operator[]
                         (in_stack_fffffffffffffef0,
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      dVar6 = positionTy::ts(pvVar5);
      if (local_18 < dVar6) {
        DataRefs::GetViewPos();
        std::deque<positionTy,_std::allocator<positionTy>_>::front
                  ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_ffffffffffffff00);
        p1 = (positionTy *)
             CoordDistance(in_stack_ffffffffffffff00,
                           (positionTy *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        iVar3 = DataRefs::GetFdStdDistance_m(&dataRefs);
        iVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffef8);
        if ((double)p1 <= (double)iVar3) {
          DataRefs::GetViewPos();
          std::deque<positionTy,_std::allocator<positionTy>_>::operator[]
                    (in_stack_fffffffffffffef0,
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          dVar6 = CoordDistance(p1,(positionTy *)CONCAT44(iVar3,iVar7));
          iVar3 = DataRefs::GetFdStdDistance_m(&dataRefs);
          iVar7 = (uint)((double)iVar3 < dVar6) << 0x18;
        }
        if ((char)((uint)iVar7 >> 0x18) == '\0') {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
        goto LAB_001d21ec;
      }
    }
    local_1 = false;
  }
LAB_001d21ec:
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1d21f9);
  return local_1;
}

Assistant:

bool LTFlightData::validForAcCreate(double simTime) const
{
    // access guarded by a mutex
    std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

    // the obvious stuff first: we need basic data
    if ( empty() || dynDataDeque.empty() || posDeque.size() < 2 )
        return false;

    // simTime defaults to 'now'
    if (std::isnan(simTime))
        simTime = dataRefs.GetSimTime();

    // so we have two positions...
    // if it is _not_ one in the past, one in the future, then bail
    if (!(posDeque.front().ts() <= simTime && simTime < posDeque[1].ts()))
        return false;
    
    // So first pos is in the past, second in the future, great...
    // both are within limits in terms of distance?
    if (CoordDistance(dataRefs.GetViewPos(), posDeque.front()) > dataRefs.GetFdStdDistance_m() ||
        CoordDistance(dataRefs.GetViewPos(), posDeque[1]     ) > dataRefs.GetFdStdDistance_m())
        return false;

    // All checks passed
    return true;
}